

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O1

void __thiscall
fasttext::QuantMatrix::averageRowsToVector
          (QuantMatrix *this,Vector *x,vector<int,_std::allocator<int>_> *rows)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  uint *puVar3;
  undefined1 in_ZMM0 [64];
  
  Vector::zero(x);
  for (puVar3 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
      puVar1 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish, puVar3 != puVar1; puVar3 = puVar3 + 1) {
    (*(this->super_Matrix)._vptr_Matrix[4])(this,x,(ulong)*puVar3);
  }
  auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,
                              (long)puVar1 -
                              (long)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start >> 2);
  Vector::mul(x,(float)(1.0 / auVar2._0_8_));
  return;
}

Assistant:

void QuantMatrix::averageRowsToVector(Vector& x, const std::vector<int32_t>& rows) const {
  x.zero();
  for (auto it = rows.cbegin(); it != rows.cend(); ++it) {
    addRowToVector(x, *it);
  }
  x.mul(1.0 / rows.size());
}